

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_reg_alloc_dup(TCGContext_conflict9 *s,TCGOp *op)

{
  uint uVar1;
  uint uVar2;
  tcg_target_ulong val_00;
  _Bool _Var3;
  TCGType_conflict type;
  uint vece_00;
  TCGType_conflict type_00;
  TCGReg TVar4;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGRegSet local_5c;
  TCGRegSet allocated_regs;
  tcg_target_ulong val;
  _Bool ok;
  uint vece;
  intptr_t endian_fixup;
  TCGType_conflict vtype;
  TCGType_conflict itype;
  TCGTemp *ots;
  TCGTemp *its;
  TCGRegSet dup_in_regs;
  TCGRegSet dup_out_regs;
  TCGLifeData arg_life;
  TCGOp *op_local;
  TCGContext_conflict9 *s_local;
  
  uVar1 = *(uint *)op;
  ts = arg_temp(op->args[0]);
  ts_00 = arg_temp(op->args[1]);
  type = (TCGType_conflict)((ulong)*(undefined8 *)ts_00 >> 0x18) & 0xff;
  vece_00 = *(uint *)op >> 0xc & 0xf;
  type_00 = (*(uint *)op >> 8 & 0xf) + TCG_TYPE_V64;
  if (((uint)((ulong)*(undefined8 *)ts_00 >> 8) & 0xff) == 3) {
    val_00 = ts_00->val;
    if ((uVar1 & 0x80000) != 0) {
      temp_dead(s,ts_00);
    }
    tcg_reg_alloc_do_movi(s,ts,val_00,(TCGLifeData)(uVar1 >> 0x10),op->output_pref[0]);
    return;
  }
  uVar2 = s->tcg_op_defs[0x8b].args_ct[1].u.regs;
  if (((uint)((ulong)*(undefined8 *)ts >> 8) & 0xff) != 1) {
    local_5c = s->reserved_regs;
    if (((uVar1 & 0x80000) == 0) && (((uint)((ulong)*(undefined8 *)ts_00 >> 8) & 0xff) == 1)) {
      local_5c = 1 << ((byte)*(undefined8 *)ts_00 & 0x1f) | local_5c;
    }
    TVar4 = tcg_reg_alloc(s,((s->tcg_op_defs[0x8b].args_ct)->u).regs,local_5c,op->output_pref[0],
                          (*(ulong *)ts >> 0x22 & 1) != 0);
    *(ulong *)ts = *(ulong *)ts & 0xffffffffffffff00 | (ulong)TVar4 & 0xff;
    *(ulong *)ts = *(ulong *)ts & 0xffffffffffff00ff | 0x100;
    *(ulong *)ts = *(ulong *)ts & 0xfffffff7ffffffff;
    s->reg_to_temp[(uint)*(undefined8 *)ts & 0xff] = ts;
  }
  if (ts_00->field_0x1 != '\x01') {
    if (ts_00->field_0x1 != '\x02') {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                 ,0xd22,(char *)0x0);
    }
    goto LAB_012d7cbe;
  }
  if (((uVar2 >> ((byte)*(undefined8 *)ts_00 & 0x1f) & 1) != 0) &&
     (_Var3 = tcg_out_dup_vec(s,type_00,vece_00,(TCGReg)*(undefined8 *)ts & 0xff,
                              (TCGReg)*(undefined8 *)ts_00 & 0xff), _Var3)) goto LAB_012d7d9b;
  if ((*(ulong *)ts_00 >> 0x23 & 1) == 0) {
    _Var3 = tcg_out_mov(s,type,(TCGReg)*(undefined8 *)ts & 0xff,(TCGReg)*(undefined8 *)ts_00 & 0xff)
    ;
    if (!_Var3) {
      temp_sync(s,ts_00,s->reserved_regs,0,0);
      goto LAB_012d7cbe;
    }
  }
  else {
LAB_012d7cbe:
    _Var3 = tcg_out_dupm_vec(s,type_00,vece_00,(TCGReg)*(undefined8 *)ts & 0xff,
                             (TCGReg)*(undefined8 *)ts_00->mem_base & 0xff,ts_00->mem_offset);
    if (_Var3) goto LAB_012d7d9b;
    tcg_out_ld(s,type,(TCGReg)*(undefined8 *)ts & 0xff,(TCGReg)*(undefined8 *)ts_00->mem_base & 0xff
               ,ts_00->mem_offset);
  }
  tcg_out_dup_vec(s,type_00,vece_00,(TCGReg)*(undefined8 *)ts & 0xff,
                  (TCGReg)*(undefined8 *)ts & 0xff);
LAB_012d7d9b:
  if ((uVar1 & 0x80000) != 0) {
    temp_dead(s,ts_00);
  }
  if ((uVar1 & 0x10000) != 0) {
    temp_sync(s,ts,s->reserved_regs,0,0);
  }
  if ((uVar1 & 0x40000) != 0) {
    temp_dead(s,ts);
  }
  return;
}

Assistant:

static void tcg_reg_alloc_dup(TCGContext *s, const TCGOp *op)
{
    const TCGLifeData arg_life = op->life;
    TCGRegSet dup_out_regs, dup_in_regs;
    TCGTemp *its, *ots;
    TCGType itype, vtype;
    intptr_t endian_fixup;
    unsigned vece;
    bool ok;

    ots = arg_temp(op->args[0]);
    its = arg_temp(op->args[1]);

    /* ENV should not be modified.  */
    tcg_debug_assert(!ots->fixed_reg);

    itype = its->type;
    vece = TCGOP_VECE(op);
    vtype = TCGOP_VECL(op) + TCG_TYPE_V64;

    if (its->val_type == TEMP_VAL_CONST) {
        /* Propagate constant via movi -> dupi.  */
        tcg_target_ulong val = its->val;
        if (IS_DEAD_ARG(1)) {
            temp_dead(s, its);
        }
        tcg_reg_alloc_do_movi(s, ots, val, arg_life, op->output_pref[0]);
        return;
    }

    dup_out_regs = s->tcg_op_defs[INDEX_op_dup_vec].args_ct[0].u.regs;
    dup_in_regs = s->tcg_op_defs[INDEX_op_dup_vec].args_ct[1].u.regs;

    /* Allocate the output register now.  */
    if (ots->val_type != TEMP_VAL_REG) {
        TCGRegSet allocated_regs = s->reserved_regs;

        if (!IS_DEAD_ARG(1) && its->val_type == TEMP_VAL_REG) {
            /* Make sure to not spill the input register. */
            tcg_regset_set_reg(allocated_regs, its->reg);
        }
        ots->reg = tcg_reg_alloc(s, dup_out_regs, allocated_regs,
                                 op->output_pref[0], ots->indirect_base);
        ots->val_type = TEMP_VAL_REG;
        ots->mem_coherent = 0;
        s->reg_to_temp[ots->reg] = ots;
    }

    switch (its->val_type) {
    case TEMP_VAL_REG:
        /*
         * The dup constriaints must be broad, covering all possible VECE.
         * However, tcg_op_dup_vec() gets to see the VECE and we allow it
         * to fail, indicating that extra moves are required for that case.
         */
        if (tcg_regset_test_reg(dup_in_regs, its->reg)) {
            if (tcg_out_dup_vec(s, vtype, vece, ots->reg, its->reg)) {
                goto done;
            }
            /* Try again from memory or a vector input register.  */
        }
        if (!its->mem_coherent) {
            /*
             * The input register is not synced, and so an extra store
             * would be required to use memory.  Attempt an integer-vector
             * register move first.  We do not have a TCGRegSet for this.
             */
            if (tcg_out_mov(s, itype, ots->reg, its->reg)) {
                break;
            }
            /* Sync the temp back to its slot and load from there.  */
            temp_sync(s, its, s->reserved_regs, 0, 0);
        }
        /* fall through */

    case TEMP_VAL_MEM:
#ifdef HOST_WORDS_BIGENDIAN
        endian_fixup = itype == TCG_TYPE_I32 ? 4 : 8;
        endian_fixup -= 1 << vece;
#else
        endian_fixup = 0;
#endif
        if (tcg_out_dupm_vec(s, vtype, vece, ots->reg, its->mem_base->reg,
                             its->mem_offset + endian_fixup)) {
            goto done;
        }
        tcg_out_ld(s, itype, ots->reg, its->mem_base->reg, its->mem_offset);
        break;

    default:
        g_assert_not_reached();
    }

    /* We now have a vector input register, so dup must succeed. */
    ok = tcg_out_dup_vec(s, vtype, vece, ots->reg, ots->reg);
    tcg_debug_assert(ok);

 done:
    if (IS_DEAD_ARG(1)) {
        temp_dead(s, its);
    }
    if (NEED_SYNC_ARG(0)) {
        temp_sync(s, ots, s->reserved_regs, 0, 0);
    }
    if (IS_DEAD_ARG(0)) {
        temp_dead(s, ots);
    }
}